

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&,char>>
                 (char *begin,char *end,
                 id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
                 *handler)

{
  byte bVar1;
  format_string_checker<char,_fmt::v5::internal::error_handler> *pfVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *message;
  error_handler *this;
  uint uVar5;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pfVar2 = handler->handler;
    this = (error_handler *)&pfVar2->context_;
    uVar5 = (pfVar2->context_).next_arg_id_;
    if ((int)uVar5 < 0) {
      error_handler::on_error(this,"cannot switch from manual to automatic argument indexing");
      uVar5 = 0;
    }
    else {
      (pfVar2->context_).next_arg_id_ = uVar5 + 1;
    }
    pfVar2->arg_id_ = uVar5;
LAB_001cf869:
    message = "argument index out of range";
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      uVar5 = 0;
      pbVar4 = (byte *)begin;
      if (bVar1 != 0x30) {
        do {
          if (0xccccccc < uVar5) {
            begin = (char *)(pbVar4 + -1);
            uVar5 = 0x80000000;
            goto LAB_001cf8d5;
          }
          uVar5 = ((uint)bVar1 + uVar5 * 10) - 0x30;
          begin = end;
          if (pbVar4 == (byte *)end) break;
          bVar1 = *pbVar4;
          begin = (char *)pbVar4;
          pbVar4 = pbVar4 + 1;
        } while ((byte)(bVar1 - 0x30) < 10);
        if ((int)uVar5 < 0) {
LAB_001cf8d5:
          error_handler::on_error((error_handler *)&handler->handler->context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == 0x3a || (*begin == 0x7d)))) {
        pfVar2 = handler->handler;
        pfVar2->arg_id_ = uVar5;
        this = (error_handler *)&pfVar2->context_;
        if ((pfVar2->context_).next_arg_id_ < 1) {
          (pfVar2->context_).next_arg_id_ = -1;
        }
        else {
          error_handler::on_error(this,"cannot switch from automatic to manual argument indexing");
        }
        goto LAB_001cf869;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar4 = (byte *)(begin + 1);
      do {
        pbVar3 = pbVar4;
        if (pbVar3 == (byte *)end) {
          return end;
        }
        bVar1 = *pbVar3;
        pbVar4 = pbVar3 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      return (char *)pbVar3;
    }
    this = (error_handler *)&handler->handler->context_;
    message = "invalid format string";
  }
  error_handler::on_error(this,message);
  return (char *)(byte *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}